

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

string * testing::internal::
         DefaultParamName<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,int>>
                   (TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
                    *info)

{
  Message *in_RSI;
  string *in_RDI;
  Message name_stream;
  unsigned_long *in_stack_ffffffffffffffb8;
  string *this;
  
  this = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffb8);
  Message::GetString_abi_cxx11_((Message *)this);
  Message::~Message((Message *)0x55368a);
  return this;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}